

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImFormatStringV(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  int local_2c;
  int w;
  __va_list_tag *args_local;
  char *fmt_local;
  int buf_size_local;
  char *buf_local;
  
  if (0 < buf_size) {
    local_2c = vsnprintf(buf,(long)buf_size,fmt,args);
    if ((local_2c == -1) || (buf_size <= local_2c)) {
      local_2c = buf_size + -1;
    }
    buf[local_2c] = '\0';
    return local_2c;
  }
  __assert_fail("buf_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                ,0x3cc,"int ImFormatStringV(char *, int, const char *, __va_list_tag *)");
}

Assistant:

int ImFormatStringV(char* buf, int buf_size, const char* fmt, va_list args)
{
    IM_ASSERT(buf_size > 0);
    int w = vsnprintf(buf, buf_size, fmt, args);
    if (w == -1 || w >= buf_size)
        w = buf_size - 1;
    buf[w] = 0;
    return w;
}